

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O0

void __thiscall Search::BaseTask::BaseTask(BaseTask *this,search *_sch,multi_ex *_ec)

{
  multi_ex *_ec_local;
  search *_sch_local;
  BaseTask *this_local;
  
  this->sch = _sch;
  this->ec = _ec;
  this->_foreach_action = (_func_void_search_ptr_size_t_float_action_bool_float *)0x0;
  this->_post_prediction = (_func_void_search_ptr_size_t_action_float *)0x0;
  this->_maybe_override_prediction = (_func_bool_search_ptr_size_t_action_ptr_float_ptr *)0x0;
  this->_with_output_string = (_func_void_search_ptr_stringstream_ptr *)0x0;
  this->_final_run = false;
  return;
}

Assistant:

BaseTask(search* _sch, multi_ex& _ec) : sch(_sch), ec(_ec)
  {
    _foreach_action = nullptr;
    _post_prediction = nullptr;
    _maybe_override_prediction = nullptr;
    _with_output_string = nullptr;
    _final_run = false;
  }